

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O0

IndexVector * __thiscall
Centaurus::CharClass<wchar_t>::collect_borders
          (IndexVector *__return_storage_ptr__,CharClass<wchar_t> *this)

{
  bool bVar1;
  size_type sVar2;
  wchar_t local_58 [5];
  wchar_t local_44;
  reference local_40;
  Range<wchar_t> *r;
  const_iterator __end0;
  const_iterator __begin0;
  vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_> *__range2;
  CharClass<wchar_t> *this_local;
  IndexVector *ret;
  
  sVar2 = std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::size
                    (&this->m_ranges);
  IndexVector::IndexVector(__return_storage_ptr__,sVar2 << 1,true);
  __end0 = std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::
           begin(&this->m_ranges);
  r = (Range<wchar_t> *)
      std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::end
                (&this->m_ranges);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
                                     *)&r), bVar1) {
    local_40 = __gnu_cxx::
               __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
               ::operator*(&__end0);
    local_44 = Range<wchar_t>::start(local_40);
    std::vector<int,_std::allocator<int>_>::push_back
              (&__return_storage_ptr__->super_vector<int,_std::allocator<int>_>,&local_44);
    local_58[0] = Range<wchar_t>::end(local_40);
    std::vector<int,_std::allocator<int>_>::push_back
              (&__return_storage_ptr__->super_vector<int,_std::allocator<int>_>,local_58);
    __gnu_cxx::
    __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
    ::operator++(&__end0);
  }
  return __return_storage_ptr__;
}

Assistant:

IndexVector collect_borders() const
    {
        IndexVector ret(2 * m_ranges.size(), true);

        for (const auto& r : m_ranges)
        {
            ret.push_back(r.start());
            ret.push_back(r.end());
        }

        return ret;
    }